

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O2

Vector2 Vector2MoveTowards(Vector2 v,Vector2 target,float maxDistance)

{
  Vector2 VVar1;
  undefined1 auVar2 [16];
  float in_XMM0_Dc;
  float in_XMM0_Dd;
  float in_XMM1_Dc;
  float in_XMM1_Dd;
  undefined1 auVar3 [16];
  float fVar4;
  
  auVar3._0_4_ = target.x - v.x;
  auVar3._4_4_ = target.y - v.y;
  auVar3._8_4_ = in_XMM1_Dc - in_XMM0_Dc;
  auVar3._12_4_ = in_XMM1_Dd - in_XMM0_Dd;
  fVar4 = auVar3._0_4_ * auVar3._0_4_ + auVar3._4_4_ * auVar3._4_4_;
  if (((fVar4 != 0.0) || (NAN(fVar4))) &&
     ((maxDistance < 0.0 || (maxDistance * maxDistance < fVar4)))) {
    fVar4 = SQRT(fVar4);
    auVar2._4_4_ = fVar4;
    auVar2._0_4_ = fVar4;
    auVar2._8_4_ = fVar4;
    auVar2._12_4_ = fVar4;
    auVar3 = divps(auVar3,auVar2);
    VVar1.y = maxDistance * auVar3._4_4_ + v.y;
    VVar1.x = maxDistance * auVar3._0_4_ + v.x;
    return VVar1;
  }
  return target;
}

Assistant:

RMAPI Vector2 Vector2MoveTowards(Vector2 v, Vector2 target, float maxDistance)
{
    Vector2 result = { 0 };

    float dx = target.x - v.x;
    float dy = target.y - v.y;
    float value = (dx*dx) + (dy*dy);

    if ((value == 0) || ((maxDistance >= 0) && (value <= maxDistance*maxDistance))) return target;

    float dist = sqrtf(value);

    result.x = v.x + dx/dist*maxDistance;
    result.y = v.y + dy/dist*maxDistance;

    return result;
}